

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_just_one_handshake(void)

{
  ptls_context_t *ppVar1;
  ptls_sign_certificate_t client_sc;
  ptls_sign_certificate_t server_sc;
  ptls_sign_certificate_t local_10;
  ptls_sign_certificate_t local_8;
  
  ppVar1 = ctx_peer;
  local_8.cb = sign_certificate;
  sc_orig = ctx_peer->sign_certificate;
  ctx_peer->sign_certificate = &local_8;
  ppVar1->private_key_method = &private_key_method;
  local_10.cb = second_sign_certificate;
  if (ppVar1 != ctx) {
    second_sc_orig = ctx->sign_certificate;
    ctx->sign_certificate = &local_10;
  }
  test_full_handshake_impl(0);
  return;
}

Assistant:

void test_just_one_handshake(void)
{
    ptls_sign_certificate_t server_sc = {sign_certificate};
    sc_orig = ctx_peer->sign_certificate;
    ctx_peer->sign_certificate = &server_sc;
    ctx_peer->private_key_method = &private_key_method;
    ptls_sign_certificate_t client_sc = {second_sign_certificate};
    if (ctx_peer != ctx) {
        second_sc_orig = ctx->sign_certificate;
        ctx->sign_certificate = &client_sc;
    }
    test_full_handshake();
}